

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::addStructBuffArguments
          (HlslParseContext *this,TSourceLoc *loc,TIntermAggregate **aggregate)

{
  _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
  *p_Var1;
  TIntermediate *this_00;
  TSourceLoc *loc_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar4;
  long lVar5;
  undefined4 extraout_var_04;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *name;
  TVariable *variable;
  mapped_type_conflict2 *pmVar6;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TIntermNode **__args;
  long lVar7;
  _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
  *this_01;
  _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
  *p_Var8;
  long lVar9;
  TString counterBlockName;
  TType counterType;
  TPoolAllocator *local_130;
  undefined8 local_128;
  iterator iStack_120;
  TIntermNode **local_118;
  TMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  *local_110;
  TIntermAggregate **local_108;
  TSourceLoc *local_100;
  TIntermSymbol *local_f8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_f0;
  TType local_c8;
  
  local_100 = loc;
  iVar3 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])();
  this_01 = *(_Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
              **)(CONCAT44(extraout_var,iVar3) + 8);
  iVar3 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])();
  p_Var1 = *(_Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::__0>
             **)(CONCAT44(extraout_var_00,iVar3) + 0x10);
  lVar9 = (long)p_Var1 - (long)this_01;
  if (0 < lVar9 >> 5) {
    lVar7 = (lVar9 >> 5) + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
              ::operator()(this_01,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                    )loc);
      p_Var8 = this_01;
      if (bVar2) goto LAB_00417cd8;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
              ::operator()(this_01 + 8,
                           (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                            )loc);
      p_Var8 = this_01 + 8;
      if (bVar2) goto LAB_00417cd8;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
              ::operator()(this_01 + 0x10,
                           (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                            )loc);
      p_Var8 = this_01 + 0x10;
      if (bVar2) goto LAB_00417cd8;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
              ::operator()(this_01 + 0x18,
                           (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                            )loc);
      p_Var8 = this_01 + 0x18;
      if (bVar2) goto LAB_00417cd8;
      this_01 = this_01 + 0x20;
      lVar7 = lVar7 + -1;
      lVar9 = lVar9 + -0x20;
    } while (1 < lVar7);
  }
  lVar9 = lVar9 >> 3;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      if (lVar9 != 3) {
        return;
      }
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
              ::operator()(this_01,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                    )loc);
      p_Var8 = this_01;
      if (bVar2) goto LAB_00417cd8;
      this_01 = this_01 + 8;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
            ::operator()(this_01,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                  )loc);
    p_Var8 = this_01;
    if (bVar2) goto LAB_00417cd8;
    this_01 = this_01 + 8;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<glslang::HlslParseContext::addStructBuffArguments(glslang::TSourceLoc_const&,glslang::TIntermAggregate*&)::$_0>
          ::operator()(this_01,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                )loc);
  p_Var8 = this_01;
  if (!bVar2) {
    p_Var8 = p_Var1;
  }
LAB_00417cd8:
  if (p_Var8 != p_Var1) {
    local_130 = GetThreadPoolAllocator();
    local_128 = 0;
    iStack_120._M_current = (TIntermNode **)0x0;
    local_118 = (TIntermNode **)0x0;
    iVar3 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    if (0 < (int)((ulong)(*(long *)(CONCAT44(extraout_var_01,iVar3) + 0x10) -
                         *(long *)(CONCAT44(extraout_var_01,iVar3) + 8)) >> 3)) {
      local_110 = &this->structBufferCounter;
      lVar7 = 0;
      lVar9 = 0;
      local_108 = aggregate;
      do {
        iVar3 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        __args = (TIntermNode **)(*(long *)(CONCAT44(extraout_var_02,iVar3) + 8) + lVar7);
        if (iStack_120._M_current == local_118) {
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          _M_realloc_insert<TIntermNode*const&>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)&local_130,
                     iStack_120,__args);
        }
        else {
          *iStack_120._M_current = *__args;
          iStack_120._M_current = iStack_120._M_current + 1;
        }
        iVar3 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        plVar4 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_03,iVar3) + 8) +
                                                 lVar7) + 0x18))();
        plVar4 = (long *)(**(code **)(*plVar4 + 0xf0))(plVar4);
        lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
        if ((*(uint *)(lVar5 + 8) & 0x1fe0000) == 0x960000) {
          iVar3 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])();
          plVar4 = (long *)(**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_04,iVar3) + 8) +
                                                   lVar7) + 0x60))();
          if (plVar4 != (long *)0x0) {
            TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
            loc_00 = local_100;
            counterBufferType(this,local_100,&local_c8);
            this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            name = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   (**(code **)(*plVar4 + 400))(plVar4);
            TIntermediate::
            addCounterBufferName<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>
                      (&local_f0,this_00,name);
            variable = makeInternalVariable(this,local_f0._M_dataplus._M_p,&local_c8);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
                     ::operator[](&local_110->
                                   super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_bool>_>_>
                                  ,&local_f0);
            aggregate = local_108;
            *pmVar6 = true;
            local_f8 = TIntermediate::addSymbol
                                 ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                  variable,loc_00);
            std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
            emplace_back<TIntermNode*>
                      ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)&local_130,
                       (TIntermNode **)&local_f8);
          }
        }
        lVar9 = lVar9 + 1;
        iVar3 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        lVar7 = lVar7 + 8;
      } while (lVar9 < (int)((ulong)(*(long *)(CONCAT44(extraout_var_05,iVar3) + 0x10) -
                                    *(long *)(CONCAT44(extraout_var_05,iVar3) + 8)) >> 3));
    }
    iVar3 = (*((*aggregate)->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])();
    lVar9 = CONCAT44(extraout_var_06,iVar3);
    *(undefined8 *)(lVar9 + 8) = local_128;
    *(TIntermNode ***)(lVar9 + 0x10) = iStack_120._M_current;
    *(TIntermNode ***)(lVar9 + 0x18) = local_118;
  }
  return;
}

Assistant:

void HlslParseContext::addStructBuffArguments(const TSourceLoc& loc, TIntermAggregate*& aggregate)
{
    // See if there are any SB types with counters.
    const bool hasStructBuffArg =
        std::any_of(aggregate->getSequence().begin(),
                    aggregate->getSequence().end(),
                    [this](const TIntermNode* node) {
                        return (node && node->getAsTyped() != nullptr) && hasStructBuffCounter(node->getAsTyped()->getType());
                    });

    // Nothing to do, if we didn't find one.
    if (! hasStructBuffArg)
        return;

    TIntermSequence argsWithCounterBuffers;

    for (int param = 0; param < int(aggregate->getSequence().size()); ++param) {
        argsWithCounterBuffers.push_back(aggregate->getSequence()[param]);

        if (hasStructBuffCounter(aggregate->getSequence()[param]->getAsTyped()->getType())) {
            const TIntermSymbol* blockSym = aggregate->getSequence()[param]->getAsSymbolNode();
            if (blockSym != nullptr) {
                TType counterType;
                counterBufferType(loc, counterType);

                const TString counterBlockName(intermediate.addCounterBufferName(blockSym->getName()));

                TVariable* variable = makeInternalVariable(counterBlockName, counterType);

                // Mark this buffer's counter block as being in use
                structBufferCounter[counterBlockName] = true;

                TIntermSymbol* sym = intermediate.addSymbol(*variable, loc);
                argsWithCounterBuffers.push_back(sym);
            }
        }
    }

    // Swap with the temp list we've built up.
    aggregate->getSequence().swap(argsWithCounterBuffers);
}